

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crosser.cc
# Opt level: O3

int __thiscall S2EdgeCrosser::CrossingSignInternal2(S2EdgeCrosser *this,S2Point *d)

{
  double dVar1;
  S2Point *pSVar2;
  S2Point *pSVar3;
  S2Point *b;
  double dVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Vector3_d local_48;
  S2LogMessage local_30;
  
  if (this->have_tangents_ == false) {
    S2::RobustCrossProd(&local_48,this->a_,this->b_);
    dVar11 = SQRT(local_48.c_[2] * local_48.c_[2] +
                  local_48.c_[0] * local_48.c_[0] + local_48.c_[1] * local_48.c_[1]);
    dVar9 = (double)(~-(ulong)(dVar11 != 0.0) & (ulong)dVar11 |
                    (ulong)(1.0 / dVar11) & -(ulong)(dVar11 != 0.0));
    dVar12 = dVar9 * local_48.c_[1];
    pSVar2 = this->a_;
    pSVar3 = this->b_;
    dVar11 = pSVar2->c_[0];
    dVar10 = dVar9 * local_48.c_[2];
    dVar9 = dVar9 * local_48.c_[0];
    dVar1 = pSVar2->c_[1];
    dVar4 = pSVar2->c_[2];
    (this->a_tangent_).c_[0] = dVar1 * dVar10 - dVar4 * dVar12;
    (this->a_tangent_).c_[1] = dVar4 * dVar9 - dVar11 * dVar10;
    (this->a_tangent_).c_[2] = dVar11 * dVar12 - dVar1 * dVar9;
    dVar11 = pSVar3->c_[0];
    dVar1 = pSVar3->c_[1];
    dVar4 = pSVar3->c_[2];
    (this->b_tangent_).c_[0] = dVar4 * dVar12 - dVar10 * dVar1;
    (this->b_tangent_).c_[1] = dVar11 * dVar10 - dVar9 * dVar4;
    (this->b_tangent_).c_[2] = dVar9 * dVar1 - dVar12 * dVar11;
    this->have_tangents_ = true;
  }
  if (CrossingSignInternal2(Vector3<double>const&)::kError == '\0') {
    CrossingSignInternal2();
  }
  pSVar2 = this->c_;
  dVar11 = (this->a_tangent_).c_[0];
  dVar1 = (this->a_tangent_).c_[1];
  dVar4 = (this->a_tangent_).c_[2];
  if ((CrossingSignInternal2::kError <
       pSVar2->c_[2] * dVar4 + pSVar2->c_[0] * dVar11 + 0.0 + pSVar2->c_[1] * dVar1) &&
     (CrossingSignInternal2::kError < dVar4 * d->c_[2] + dVar11 * d->c_[0] + 0.0 + dVar1 * d->c_[1])
     ) {
    return -1;
  }
  dVar11 = (this->b_tangent_).c_[0];
  dVar1 = (this->b_tangent_).c_[1];
  dVar4 = (this->b_tangent_).c_[2];
  if ((CrossingSignInternal2::kError <
       pSVar2->c_[2] * dVar4 + pSVar2->c_[0] * dVar11 + 0.0 + pSVar2->c_[1] * dVar1) &&
     (CrossingSignInternal2::kError < dVar4 * d->c_[2] + dVar11 * d->c_[0] + 0.0 + dVar1 * d->c_[1])
     ) {
    return -1;
  }
  pSVar3 = this->a_;
  lVar7 = 0;
  do {
    dVar11 = *(double *)((long)pSVar3->c_ + lVar7);
    dVar1 = *(double *)((long)pSVar2->c_ + lVar7);
    if ((dVar11 != dVar1) || (NAN(dVar11) || NAN(dVar1))) break;
    bVar8 = lVar7 != 0x10;
    lVar7 = lVar7 + 8;
  } while (bVar8);
  if ((dVar11 == dVar1) && (!NAN(dVar11) && !NAN(dVar1))) {
    return 0;
  }
  lVar7 = 0;
  do {
    dVar11 = *(double *)((long)pSVar3->c_ + lVar7);
    dVar1 = *(double *)((long)d->c_ + lVar7);
    if ((dVar11 != dVar1) || (NAN(dVar11) || NAN(dVar1))) break;
    bVar8 = lVar7 != 0x10;
    lVar7 = lVar7 + 8;
  } while (bVar8);
  if ((dVar11 == dVar1) && (!NAN(dVar11) && !NAN(dVar1))) {
    return 0;
  }
  b = this->b_;
  lVar7 = 0;
  do {
    dVar11 = *(double *)((long)b->c_ + lVar7);
    dVar1 = *(double *)((long)pSVar2->c_ + lVar7);
    if ((dVar11 != dVar1) || (NAN(dVar11) || NAN(dVar1))) break;
    bVar8 = lVar7 != 0x10;
    lVar7 = lVar7 + 8;
  } while (bVar8);
  if ((dVar11 == dVar1) && (!NAN(dVar11) && !NAN(dVar1))) {
    return 0;
  }
  lVar7 = 0;
  do {
    dVar11 = *(double *)((long)b->c_ + lVar7);
    dVar1 = *(double *)((long)d->c_ + lVar7);
    if ((dVar11 != dVar1) || (NAN(dVar11) || NAN(dVar1))) break;
    bVar8 = lVar7 != 0x10;
    lVar7 = lVar7 + 8;
  } while (bVar8);
  if ((dVar11 == dVar1) && (!NAN(dVar11) && !NAN(dVar1))) {
    return 0;
  }
  lVar7 = 0;
  do {
    dVar11 = *(double *)((long)pSVar3->c_ + lVar7);
    dVar1 = *(double *)((long)b->c_ + lVar7);
    if ((dVar11 != dVar1) || (NAN(dVar11) || NAN(dVar1))) break;
    bVar8 = lVar7 != 0x10;
    lVar7 = lVar7 + 8;
  } while (bVar8);
  if ((dVar11 == dVar1) && (!NAN(dVar11) && !NAN(dVar1))) {
    return -1;
  }
  lVar7 = 0;
  do {
    dVar11 = *(double *)((long)pSVar2->c_ + lVar7);
    dVar1 = *(double *)((long)d->c_ + lVar7);
    if ((dVar11 != dVar1) || (NAN(dVar11) || NAN(dVar1))) break;
    bVar8 = lVar7 != 0x10;
    lVar7 = lVar7 + 8;
  } while (bVar8);
  if ((dVar11 == dVar1) && (!NAN(dVar11) && !NAN(dVar1))) {
    return -1;
  }
  iVar6 = this->acb_;
  if (iVar6 == 0) {
    iVar5 = s2pred::ExpensiveSign(pSVar3,b,pSVar2,true);
    iVar6 = -iVar5;
    this->acb_ = iVar6;
    if (iVar5 == 0) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.cc"
                 ,0x49,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_48.c_[1],"Check failed: (acb_) != (0) ",0x1c);
      goto LAB_001e9dbb;
    }
  }
  iVar5 = this->bda_;
  if (iVar5 == 0) {
    iVar5 = s2pred::ExpensiveSign(this->a_,this->b_,d,true);
    this->bda_ = iVar5;
    if (iVar5 == 0) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.cc"
                 ,0x4b,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_48.c_[1],"Check failed: (bda_) != (0) ",0x1c);
      goto LAB_001e9dbb;
    }
    iVar6 = this->acb_;
  }
  if (iVar5 != iVar6) {
    return -1;
  }
  pSVar2 = this->c_;
  local_48.c_[0] = d->c_[2] * pSVar2->c_[1] - pSVar2->c_[2] * d->c_[1];
  local_48.c_[1] = d->c_[0] * pSVar2->c_[2] - pSVar2->c_[0] * d->c_[2];
  local_48.c_[2] = d->c_[1] * pSVar2->c_[0] - pSVar2->c_[1] * d->c_[0];
  iVar6 = s2pred::Sign(pSVar2,d,this->b_,&local_48);
  if (iVar6 == 0) {
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.cc"
               ,0x50,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_30.stream_,"Check failed: (cbd) != (0) ",0x1b);
  }
  else {
    if (iVar6 + this->acb_ != 0) {
      return -1;
    }
    iVar6 = s2pred::Sign(this->c_,d,this->a_,&local_48);
    if (iVar6 != 0) {
      return (uint)(iVar6 == this->acb_) * 2 + -1;
    }
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.cc"
               ,0x53,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_30.stream_,"Check failed: (dac) != (0) ",0x1b);
  }
LAB_001e9dbb:
  abort();
}

Assistant:

inline int S2EdgeCrosser::CrossingSignInternal2(const S2Point& d) {
  // At this point, a very common situation is that A,B,C,D are four points on
  // a line such that AB does not overlap CD.  (For example, this happens when
  // a line or curve is sampled finely, or when geometry is constructed by
  // computing the union of S2CellIds.)  Most of the time, we can determine
  // that AB and CD do not intersect by computing the two outward-facing
  // tangents at A and B (parallel to AB) and testing whether AB and CD are on
  // opposite sides of the plane perpendicular to one of these tangents.  This
  // is moderately expensive but still much cheaper than s2pred::ExpensiveSign.
  if (!have_tangents_) {
    S2Point norm = S2::RobustCrossProd(*a_, *b_).Normalize();
    a_tangent_ = a_->CrossProd(norm);
    b_tangent_ = norm.CrossProd(*b_);
    have_tangents_ = true;
  }
  // The error in RobustCrossProd() is insignificant.  The maximum error in
  // the call to CrossProd() (i.e., the maximum norm of the error vector) is
  // (0.5 + 1/sqrt(3)) * DBL_EPSILON.  The maximum error in each call to
  // DotProd() below is DBL_EPSILON.  (There is also a small relative error
  // term that is insignificant because we are comparing the result against a
  // constant that is very close to zero.)
  static const double kError = (1.5 + 1/sqrt(3)) * DBL_EPSILON;
  if ((c_->DotProd(a_tangent_) > kError && d.DotProd(a_tangent_) > kError) ||
      (c_->DotProd(b_tangent_) > kError && d.DotProd(b_tangent_) > kError)) {
    return -1;
  }

  // Otherwise, eliminate the cases where two vertices from different edges
  // are equal.  (These cases could be handled in the code below, but we would
  // rather avoid calling ExpensiveSign whenever possible.)
  if (*a_ == *c_ || *a_ == d || *b_ == *c_ || *b_ == d) return 0;

  // Eliminate cases where an input edge is degenerate.  (Note that in most
  // cases, if CD is degenerate then this method is not even called because
  // acb_ and bda have different signs.)
  if (*a_ == *b_ || *c_ == d) return -1;

  // Otherwise it's time to break out the big guns.
  if (acb_ == 0) acb_ = -s2pred::ExpensiveSign(*a_, *b_, *c_);
  S2_DCHECK_NE(acb_, 0);
  if (bda_ == 0) bda_ = s2pred::ExpensiveSign(*a_, *b_, d);
  S2_DCHECK_NE(bda_, 0);
  if (bda_ != acb_) return -1;

  Vector3_d c_cross_d = c_->CrossProd(d);
  int cbd = -s2pred::Sign(*c_, d, *b_, c_cross_d);
  S2_DCHECK_NE(cbd, 0);
  if (cbd != acb_) return -1;
  int dac = s2pred::Sign(*c_, d, *a_, c_cross_d);
  S2_DCHECK_NE(dac, 0);
  return (dac != acb_) ? -1 : 1;
}